

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::
ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::ProblemHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
           *this,int info)

{
  int num_values;
  IntSuffixHandler suffix_handler;
  DblSuffixHandler suffix_handler_1;
  IntSuffixHandler local_1a;
  DblSuffixHandler local_19;
  
  num_values = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
               ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,1,2);
  BinaryReader<mp::internal::IdentityConverter>::ReadString
            (*(BinaryReader<mp::internal::IdentityConverter> **)this);
  if ((info & 4U) == 0) {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::IntReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::IntSuffixHandler>
              (this,num_values,1,&local_1a);
  }
  else {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::DoubleReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::DblSuffixHandler>
              (this,num_values,1,&local_19);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}